

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O0

qint64 __thiscall QUdpSocket::writeDatagram(QUdpSocket *this,QNetworkDatagram *datagram)

{
  bool bVar1;
  SocketState SVar2;
  SocketError SVar3;
  QUdpSocketPrivate *this_00;
  char *pcVar4;
  qsizetype qVar5;
  qintptr qVar6;
  socklen_t __len;
  long *in_RSI;
  QUdpSocketPrivate *in_RDI;
  long in_FS_OFFSET;
  qint64 sent;
  QUdpSocketPrivate *d;
  undefined4 in_stack_ffffffffffffff58;
  BindFlag in_stack_ffffffffffffff5c;
  QString *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  SpecialAddress address;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  quint16 bindPort;
  QAbstractSocketEngine *pQVar7;
  QHostAddress *in_stack_ffffffffffffff80;
  long local_40;
  uint local_1c;
  undefined1 local_18 [16];
  long local_8;
  
  bindPort = (quint16)((ulong)in_stack_ffffffffffffff78 >> 0x30);
  address = (SpecialAddress)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QUdpSocket *)0x266e85);
  QHostAddress::QHostAddress
            ((QHostAddress *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),address);
  QNetworkDatagram::destinationAddress
            ((QNetworkDatagram *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  __len = (socklen_t)local_18;
  bVar1 = QUdpSocketPrivate::doEnsureInitialized
                    (in_RDI,in_stack_ffffffffffffff80,bindPort,
                     (QHostAddress *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  QHostAddress::~QHostAddress((QHostAddress *)0x266ee7);
  QHostAddress::~QHostAddress((QHostAddress *)0x266ef4);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    SVar2 = QAbstractSocket::state((QAbstractSocket *)0x266f16);
    if (SVar2 == UnconnectedState) {
      QFlags<QAbstractSocket::BindFlag>::QFlags
                ((QFlags<QAbstractSocket::BindFlag> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c);
      QAbstractSocket::bind((QAbstractSocket *)in_RDI,0,(sockaddr *)(ulong)local_1c,__len);
    }
    pQVar7 = (this_00->super_QAbstractSocketPrivate).socketEngine;
    pcVar4 = QByteArray::constData((QByteArray *)0x266f5b);
    qVar5 = QByteArray::size((QByteArray *)*in_RSI);
    local_40 = (**(code **)(*(long *)pQVar7 + 0x100))(pQVar7,pcVar4,qVar5,*in_RSI + 0x18);
    qVar6 = (**(code **)(*(long *)(this_00->super_QAbstractSocketPrivate).socketEngine + 0x70))();
    (this_00->super_QAbstractSocketPrivate).cachedSocketDescriptor = qVar6;
    if (local_40 < 0) {
      SVar3 = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x266fe9);
      QAbstractSocketEngine::errorString((QAbstractSocketEngine *)this_00);
      QAbstractSocketPrivate::setErrorAndEmit
                ((QAbstractSocketPrivate *)CONCAT44(SVar3,in_stack_ffffffffffffff70),
                 (SocketError)((ulong)this_00 >> 0x20),in_stack_ffffffffffffff60);
      QString::~QString((QString *)0x267020);
    }
    else {
      QIODevice::bytesWritten((longlong)in_RDI);
    }
  }
  else {
    local_40 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

qint64 QUdpSocket::writeDatagram(const QNetworkDatagram &datagram)
{
    Q_D(QUdpSocket);
#if defined QUDPSOCKET_DEBUG
    qDebug("QUdpSocket::writeDatagram(%p, %i, \"%s\", %i)",
           datagram.d->data.constData(),
           datagram.d->data.size(),
           datagram.destinationAddress().toString().toLatin1().constData(),
           datagram.destinationPort());
#endif
    if (!d->doEnsureInitialized(QHostAddress::Any, 0, datagram.destinationAddress()))
        return -1;
    if (state() == UnconnectedState)
        bind();

    qint64 sent = d->socketEngine->writeDatagram(datagram.d->data.constData(),
                                                 datagram.d->data.size(),
                                                 datagram.d->header);
    d->cachedSocketDescriptor = d->socketEngine->socketDescriptor();

    if (sent >= 0) {
        emit bytesWritten(sent);
    } else {
        d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
    }
    return sent;
}